

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::TimeZoneFormat::parseDefaultOffsetFields
          (TimeZoneFormat *this,UnicodeString *text,int32_t start,UChar separator,int32_t *parsedLen
          )

{
  short sVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  char16_t *pcVar5;
  uint uVar6;
  undefined6 in_register_0000000a;
  int iVar7;
  int32_t iVar8;
  char16_t cVar9;
  int32_t iVar10;
  uint uVar11;
  uint uVar12;
  int32_t len;
  undefined4 local_44;
  TimeZoneFormat *local_40;
  int32_t *local_38;
  
  local_44 = (undefined4)CONCAT62(in_register_0000000a,separator);
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar10 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar10 = (int)sVar1 >> 5;
  }
  iVar8 = 0;
  len = 0;
  *parsedLen = 0;
  local_40 = this;
  local_38 = parsedLen;
  iVar2 = parseOffsetFieldWithLocalizedDigits(this,text,start,'\x01','\x02',0,0x17,&len);
  iVar3 = 0;
  iVar4 = 0;
  uVar12 = start;
  if (len == 0) goto LAB_002013bb;
  uVar11 = len + start;
  iVar7 = len + start + 1;
  uVar12 = uVar11;
  if (iVar7 < iVar10) {
    sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      uVar6 = (text->fUnion).fFields.fLength;
    }
    else {
      uVar6 = (int)sVar1 >> 5;
    }
    cVar9 = L'\xffff';
    if (uVar11 < uVar6) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar5 = (text->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&text->fUnion + 2);
      }
      cVar9 = pcVar5[(int)uVar11];
    }
    if (cVar9 != (char16_t)local_44) goto LAB_002013b3;
    iVar3 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar7,'\x02','\x02',0,0x3b,&len);
    if (len != 0) {
      uVar12 = uVar11 + len + 1;
      iVar7 = uVar11 + len + 2;
      if (iVar7 < iVar10) {
        sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar11 = (text->fUnion).fFields.fLength;
        }
        else {
          uVar11 = (int)sVar1 >> 5;
        }
        cVar9 = L'\xffff';
        if (uVar12 < uVar11) {
          if (((int)sVar1 & 2U) == 0) {
            pcVar5 = (text->fUnion).fFields.fArray;
          }
          else {
            pcVar5 = (char16_t *)((long)&text->fUnion + 2);
          }
          cVar9 = pcVar5[(int)uVar12];
        }
        if (cVar9 == (char16_t)local_44) {
          iVar4 = parseOffsetFieldWithLocalizedDigits(local_40,text,iVar7,'\x02','\x02',0,0x3b,&len)
          ;
          if (len != 0) {
            uVar12 = uVar12 + len + 1;
          }
          goto LAB_002013bb;
        }
      }
    }
  }
  else {
LAB_002013b3:
    iVar3 = 0;
  }
  iVar4 = 0;
LAB_002013bb:
  if (uVar12 - start != 0) {
    *local_38 = uVar12 - start;
    iVar8 = iVar4 * 1000 + iVar3 * 60000 + iVar2 * 3600000;
  }
  return iVar8;
}

Assistant:

int32_t
TimeZoneFormat::parseDefaultOffsetFields(const UnicodeString& text, int32_t start, UChar separator, int32_t& parsedLen) const {
    int32_t max = text.length();
    int32_t idx = start;
    int32_t len = 0;
    int32_t hour = 0, min = 0, sec = 0;

    parsedLen = 0;

    do {
        hour = parseOffsetFieldWithLocalizedDigits(text, idx, 1, 2, 0, MAX_OFFSET_HOUR, len);
        if (len == 0) {
            break;
        }
        idx += len;

        if (idx + 1 < max && text.charAt(idx) == separator) {
            min = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_MINUTE, len);
            if (len == 0) {
                break;
            }
            idx += (1 + len);

            if (idx + 1 < max && text.charAt(idx) == separator) {
                sec = parseOffsetFieldWithLocalizedDigits(text, idx + 1, 2, 2, 0, MAX_OFFSET_SECOND, len);
                if (len == 0) {
                    break;
                }
                idx += (1 + len);
            }
        }
    } while (FALSE);

    if (idx == start) {
        return 0;
    }

    parsedLen = idx - start;
    return hour * MILLIS_PER_HOUR + min * MILLIS_PER_MINUTE + sec * MILLIS_PER_SECOND;
}